

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O2

Am_Wrapper * __thiscall Am_Value_List_Data::Make_Unique(Am_Value_List_Data *this)

{
  Am_Value_List_Data *this_00;
  
  this_00 = this;
  if ((this->super_Am_Wrapper).refs != 1) {
    Am_Wrapper::Release(&this->super_Am_Wrapper);
    this_00 = (Am_Value_List_Data *)operator_new(0x20);
    Am_Value_List_Data(this_00,this);
  }
  return &this_00->super_Am_Wrapper;
}

Assistant:

Am_Value_List_Data::Am_Value_List_Data()
{
  head = nullptr;
  tail = nullptr;
  number = 0;
}